

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

char * hts_idx_getfn(char *fn,char *ext)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  sVar1 = strlen(fn);
  sVar2 = strlen(ext);
  iVar6 = (int)sVar1;
  pcVar3 = (char *)calloc((long)((int)sVar2 + iVar6 + 1),1);
  strcpy(pcVar3,fn);
  strcpy(pcVar3 + iVar6,ext);
  __s = test_and_fetch(pcVar3);
  if (__s == (char *)0x0) {
    uVar4 = sVar1 & 0xffffffff;
    iVar5 = 1;
    if (iVar6 < 1) {
      iVar5 = iVar6;
    }
    do {
      uVar4 = uVar4 - 1;
      uVar7 = iVar5 - 1;
      if ((int)sVar1 < 2) break;
      uVar7 = (int)sVar1 - 1;
      sVar1 = (size_t)uVar7;
    } while (pcVar3[uVar4 & 0xffffffff] != '.');
    strcpy(pcVar3 + (int)uVar7,ext);
    __s = test_and_fetch(pcVar3);
    if (__s == (char *)0x0) {
      free(pcVar3);
      return (char *)0x0;
    }
  }
  sVar1 = strlen(__s);
  pcVar3 = (char *)memmove(pcVar3,__s,(long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
  return pcVar3;
}

Assistant:

char *hts_idx_getfn(const char *fn, const char *ext)
{
    int i, l_fn, l_ext;
    char *fnidx, *ret;
    l_fn = strlen(fn); l_ext = strlen(ext);
    fnidx = (char*)calloc(l_fn + l_ext + 1, 1);
    strcpy(fnidx, fn); strcpy(fnidx + l_fn, ext);
    if ((ret = test_and_fetch(fnidx)) == 0) {
        for (i = l_fn - 1; i > 0; --i)
            if (fnidx[i] == '.') break;
        strcpy(fnidx + i, ext);
        ret = test_and_fetch(fnidx);
    }
    if (ret == 0) {
        free(fnidx);
        return 0;
    }
    l_fn = strlen(ret);
    memmove(fnidx, ret, l_fn + 1);
    return fnidx;
}